

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseStringLiteral(char *in,char *end,Value **stringData)

{
  byte *__src;
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  Value *pVVar4;
  long lVar5;
  size_t len;
  
  *stringData = (Value *)0x0;
  if (in != end && in != (char *)0x0) {
    do {
      bVar2 = *in;
      if ((0x2c < (ulong)bVar2) || ((0x100100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
      goto LAB_0060fb93;
      in = (char *)((byte *)in + 1);
    } while (in != end);
    bVar2 = *end;
    in = end;
LAB_0060fb93:
    if (bVar2 == 0x22) {
      __src = (byte *)in + 1;
      len = 0;
      if ((__src != (byte *)end) && (((byte *)in)[1] != 0x22)) {
        lVar3 = 2;
        lVar5 = 0;
        do {
          lVar5 = lVar5 + -1;
          if ((byte *)in + lVar3 == (byte *)end) break;
          pbVar1 = (byte *)in + lVar3;
          lVar3 = lVar3 + 1;
        } while (*pbVar1 != 0x22);
        in = (char *)((byte *)in + -lVar5);
        len = -lVar5;
      }
      pVVar4 = ValueAllocator::allocPrimData(ddl_string,len);
      *stringData = pVVar4;
      strncpy((char *)pVVar4->m_data,(char *)__src,len);
      (*stringData)->m_data[len] = '\0';
      in = (char *)((byte *)in + 2);
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseStringLiteral( char *in, char *end, Value **stringData ) {
    *stringData = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    size_t len( 0 );
    char *start( in );
    if( *start == '\"' ) {
        ++start;
        ++in;
        while( *in != '\"' && in != end ) {
            ++in;
            ++len;
        }

        *stringData = ValueAllocator::allocPrimData( Value::ddl_string, len );
        ::strncpy( ( char* ) ( *stringData )->m_data, start, len );
        ( *stringData )->m_data[len] = '\0';
        ++in;
    }

    return in;
}